

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void solve_dataflow(gen_ctx_t gen_ctx,int forward_p,_func_void_bb_t *con_func_0,
                   _func_int_gen_ctx_t_bb_t *con_func_n,_func_int_gen_ctx_t_bb_t *trans_func)

{
  bb_t_conflict pbVar1;
  out_edge_t peVar2;
  in_edge_t_conflict peVar3;
  data_flow_ctx *pdVar4;
  VARR_bb_t *pVVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  size_t sVar9;
  bb_t_conflict *__base;
  bb_t_conflict obj;
  code *__compar;
  undefined4 in_register_00000034;
  VARR_bb_t *varr;
  ulong uVar10;
  long lVar11;
  DLIST_bb_t *pDVar12;
  DLIST_out_edge_t *pDVar13;
  DLIST_in_edge_t *pDVar14;
  
  obj = (bb_t_conflict)CONCAT44(in_register_00000034,forward_p);
  VARR_bb_ttrunc(gen_ctx->data_flow_ctx->worklist,(size_t)obj);
  pDVar12 = &gen_ctx->curr_cfg->bbs;
  while( true ) {
    pbVar1 = pDVar12->head;
    if (pbVar1 == (bb_t_conflict)0x0) break;
    obj = pbVar1;
    VARR_bb_tpush(gen_ctx->data_flow_ctx->worklist,pbVar1);
    pDVar12 = (DLIST_bb_t *)&(pbVar1->bb_link).next;
  }
  VARR_bb_ttrunc(gen_ctx->data_flow_ctx->pending,(size_t)obj);
  __compar = rpost_cmp;
  if (forward_p == 0) {
    __compar = post_cmp;
  }
  lVar11 = 0;
  varr = gen_ctx->data_flow_ctx->worklist;
  do {
    sVar9 = VARR_bb_tlength(varr);
    if (sVar9 == 0) {
      return;
    }
    VARR_bb_ttrunc(gen_ctx->data_flow_ctx->pending,(size_t)obj);
    __base = VARR_bb_taddr(gen_ctx->data_flow_ctx->worklist);
    obj = (bb_t_conflict)VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
    qsort(__base,(size_t)obj,8,__compar);
    bitmap_clear(gen_ctx->data_flow_ctx->bb_to_consider);
    uVar10 = 0;
    while( true ) {
      sVar9 = VARR_bb_tlength(gen_ctx->data_flow_ctx->worklist);
      if (sVar9 <= uVar10) break;
      pbVar1 = __base[uVar10];
      uVar7 = (uint)(lVar11 == 0);
      if (forward_p == 0) {
        if ((pbVar1->out_edges).head == (out_edge_t)0x0) goto LAB_0013cd7a;
LAB_0013cd65:
        obj = pbVar1;
        uVar6 = (*con_func_n)(gen_ctx,pbVar1);
        uVar7 = uVar6 | uVar7;
      }
      else {
        if ((pbVar1->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0013cd65;
LAB_0013cd7a:
        (*con_func_0)(pbVar1);
      }
      if (uVar7 != 0) {
        obj = pbVar1;
        iVar8 = (*trans_func)(gen_ctx,pbVar1);
        if (iVar8 != 0) {
          if (forward_p == 0) {
            pDVar14 = &pbVar1->in_edges;
            while (peVar3 = pDVar14->head, peVar3 != (in_edge_t_conflict)0x0) {
              obj = (bb_t_conflict)peVar3->src->index;
              iVar8 = bitmap_set_bit_p(gen_ctx->data_flow_ctx->bb_to_consider,(size_t)obj);
              if (iVar8 != 0) {
                obj = peVar3->src;
                VARR_bb_tpush(gen_ctx->data_flow_ctx->pending,obj);
              }
              pDVar14 = (DLIST_in_edge_t *)&(peVar3->in_link).next;
            }
          }
          else {
            pDVar13 = &pbVar1->out_edges;
            while (peVar2 = pDVar13->head, peVar2 != (out_edge_t)0x0) {
              obj = (bb_t_conflict)peVar2->dst->index;
              iVar8 = bitmap_set_bit_p(gen_ctx->data_flow_ctx->bb_to_consider,(size_t)obj);
              if (iVar8 != 0) {
                obj = peVar2->dst;
                VARR_bb_tpush(gen_ctx->data_flow_ctx->pending,obj);
              }
              pDVar13 = (DLIST_out_edge_t *)&(peVar2->out_link).next;
            }
          }
        }
      }
      uVar10 = uVar10 + 1;
    }
    pdVar4 = gen_ctx->data_flow_ctx;
    pVVar5 = pdVar4->worklist;
    varr = pdVar4->pending;
    lVar11 = lVar11 + 1;
    pdVar4->worklist = varr;
    pdVar4->pending = pVVar5;
  } while( true );
}

Assistant:

static void solve_dataflow (gen_ctx_t gen_ctx, int forward_p, void (*con_func_0) (bb_t),
                            int (*con_func_n) (gen_ctx_t, bb_t),
                            int (*trans_func) (gen_ctx_t, bb_t)) {
  size_t i, iter;
  bb_t bb, *addr;
  VARR (bb_t) * t;

  VARR_TRUNC (bb_t, worklist, 0);
  for (bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    VARR_PUSH (bb_t, worklist, bb);
  VARR_TRUNC (bb_t, pending, 0);
  iter = 0;
  while (VARR_LENGTH (bb_t, worklist) != 0) {
    VARR_TRUNC (bb_t, pending, 0);
    addr = VARR_ADDR (bb_t, worklist);
    qsort (addr, VARR_LENGTH (bb_t, worklist), sizeof (bb), forward_p ? rpost_cmp : post_cmp);
    bitmap_clear (bb_to_consider);
    for (i = 0; i < VARR_LENGTH (bb_t, worklist); i++) {
      int changed_p = iter == 0;
      edge_t e;

      bb = addr[i];
      if (forward_p) {
        if (DLIST_HEAD (in_edge_t, bb->in_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      } else {
        if (DLIST_HEAD (out_edge_t, bb->out_edges) == NULL)
          con_func_0 (bb);
        else
          changed_p |= con_func_n (gen_ctx, bb);
      }
      if (changed_p && trans_func (gen_ctx, bb)) {
        if (forward_p) {
          for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL;
               e = DLIST_NEXT (out_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->dst->index)) VARR_PUSH (bb_t, pending, e->dst);
        } else {
          for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e))
            if (bitmap_set_bit_p (bb_to_consider, e->src->index)) VARR_PUSH (bb_t, pending, e->src);
        }
      }
    }
    iter++;
    t = worklist;
    worklist = pending;
    pending = t;
  }
}